

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xgemm.c
# Opt level: O0

void xb_cgemm(char *transa,char *transb,int *M,int *N,int *K,void *alpha,void *a,int *p_lda,void *b,
             int *p_ldb,void *beta,void *c,int *p_ldc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int *in_RCX;
  int *in_RDX;
  char *in_RSI;
  char *in_RDI;
  int *in_R8;
  float *in_R9;
  int inccij;
  int incci;
  int incbhj;
  int incbj;
  int incaih;
  int incai;
  int cij;
  int bhj;
  int aih;
  int ci;
  int bj;
  int ai;
  int h;
  int j;
  int i;
  float local_d8;
  float local_d4;
  float local_bc;
  float local_b4;
  char order;
  float tmp2 [2];
  float tmp1 [2];
  float sum [2];
  float prod [2];
  float c_elem [2];
  float b_elem [2];
  float a_elem [2];
  int ldc;
  int ldb;
  int lda;
  int k;
  int n;
  int m;
  float *beta_i;
  float *alpha_i;
  float *c_i;
  float *b_i;
  float *a_i;
  
  iVar5 = *in_RDX;
  iVar6 = *in_RCX;
  iVar7 = *in_R8;
  fVar8 = *_incbj;
  fVar9 = *_bhj;
  if ((((0 < iVar5) && (0 < iVar6)) && (0 < iVar7)) && (iVar5 <= *_j)) {
    iVar10 = iVar5;
    if ((*in_RDI != 'n') && (*in_RDI != 'N')) {
      iVar10 = iVar7;
    }
    if (iVar10 <= (int)fVar8) {
      iVar10 = iVar7;
      if ((*in_RSI != 'n') && (*in_RSI != 'N')) {
        iVar10 = iVar6;
      }
      if ((iVar10 <= (int)fVar9) &&
         ((((*in_R9 != 0.0 || (NAN(*in_R9))) || (in_R9[1] != 0.0)) ||
          (((NAN(in_R9[1]) || (*_ci != 1.0)) || ((NAN(*_ci) || ((_ci[1] != 0.0 || (NAN(_ci[1])))))))
          )))) {
        if ((*in_RDI == 'n') || (*in_RDI == 'N')) {
          c_elem[0] = 1.4013e-45;
          prod[1] = fVar8;
        }
        else {
          prod[1] = 1.4013e-45;
          c_elem[0] = fVar8;
        }
        if ((*in_RSI == 'n') || (*in_RSI == 'N')) {
          sum[1] = 1.4013e-45;
          prod[0] = fVar9;
        }
        else {
          prod[0] = 1.4013e-45;
          sum[1] = fVar9;
        }
        iVar10 = *_j * 2;
        iVar11 = (int)c_elem[0] * 2;
        iVar12 = (int)prod[1] * 2;
        iVar13 = (int)prod[0] * 2;
        iVar14 = (int)sum[1] * 2;
        if ((((*in_R9 != 0.0) || (NAN(*in_R9))) || (in_R9[1] != 0.0)) || (NAN(in_R9[1]))) {
          if (((*in_R9 != 1.0) || (NAN(*in_R9))) || ((in_R9[1] != 0.0 || (NAN(in_R9[1]))))) {
            a_elem[0] = 0.0;
            ldc = 0;
            for (k = 0; k < iVar5; k = k + 1) {
              c_elem[1] = a_elem[0];
              a_elem[1] = 0.0;
              for (lda = 0; lda < iVar6; lda = lda + 1) {
                b_elem[1] = (float)ldc;
                b_elem[0] = a_elem[1];
                local_d4 = 0.0;
                local_d8 = 0.0;
                for (ldb = 0; ldb < iVar7; ldb = ldb + 1) {
                  fVar8 = *(float *)(_incci + (long)(int)b_elem[1] * 4);
                  local_b4 = *(float *)(_incci + (long)((int)b_elem[1] + 1) * 4);
                  fVar9 = *(float *)(_incai + (long)(int)b_elem[0] * 4);
                  local_bc = *(float *)(_incai + (long)((int)b_elem[0] + 1) * 4);
                  if ((*in_RDI == 'c') || (*in_RDI == 'C')) {
                    local_b4 = -local_b4;
                  }
                  if ((*in_RSI == 'c') || (*in_RSI == 'C')) {
                    local_bc = -local_bc;
                  }
                  local_d8 = local_d8 + fVar8 * fVar9 + -(local_b4 * local_bc);
                  local_d4 = local_d4 + fVar8 * local_bc + local_b4 * fVar9;
                  b_elem[1] = (float)(iVar12 + (int)b_elem[1]);
                  b_elem[0] = (float)(iVar14 + (int)b_elem[0]);
                }
                fVar8 = in_R9[1];
                fVar9 = *in_R9;
                fVar1 = *(float *)(_ai + (long)(int)c_elem[1] * 4);
                fVar2 = *(float *)(_ai + (long)((int)c_elem[1] + 1) * 4);
                fVar3 = _ci[1];
                fVar4 = *_ci;
                *(float *)(_ai + (long)(int)c_elem[1] * 4) =
                     local_d8 * *in_R9 + -(local_d4 * in_R9[1]) + fVar1 * *_ci + -(fVar2 * _ci[1]);
                *(float *)(_ai + (long)((int)c_elem[1] + 1) * 4) =
                     local_d8 * fVar8 + local_d4 * fVar9 + fVar1 * fVar3 + fVar2 * fVar4;
                c_elem[1] = (float)(iVar10 + (int)c_elem[1]);
                a_elem[1] = (float)(iVar13 + (int)a_elem[1]);
              }
              a_elem[0] = (float)((int)a_elem[0] + 2);
              ldc = iVar11 + ldc;
            }
          }
          else if ((((*_ci != 0.0) || (NAN(*_ci))) || (_ci[1] != 0.0)) || (NAN(_ci[1]))) {
            a_elem[0] = 0.0;
            ldc = 0;
            for (k = 0; k < iVar5; k = k + 1) {
              c_elem[1] = a_elem[0];
              a_elem[1] = 0.0;
              for (lda = 0; lda < iVar6; lda = lda + 1) {
                b_elem[1] = (float)ldc;
                b_elem[0] = a_elem[1];
                local_d4 = 0.0;
                local_d8 = 0.0;
                for (ldb = 0; ldb < iVar7; ldb = ldb + 1) {
                  fVar8 = *(float *)(_incci + (long)(int)b_elem[1] * 4);
                  local_b4 = *(float *)(_incci + (long)((int)b_elem[1] + 1) * 4);
                  fVar9 = *(float *)(_incai + (long)(int)b_elem[0] * 4);
                  local_bc = *(float *)(_incai + (long)((int)b_elem[0] + 1) * 4);
                  if ((*in_RDI == 'c') || (*in_RDI == 'C')) {
                    local_b4 = -local_b4;
                  }
                  if ((*in_RSI == 'c') || (*in_RSI == 'C')) {
                    local_bc = -local_bc;
                  }
                  local_d8 = local_d8 + fVar8 * fVar9 + -(local_b4 * local_bc);
                  local_d4 = local_d4 + fVar8 * local_bc + local_b4 * fVar9;
                  b_elem[1] = (float)(iVar12 + (int)b_elem[1]);
                  b_elem[0] = (float)(iVar14 + (int)b_elem[0]);
                }
                fVar8 = *(float *)(_ai + (long)(int)c_elem[1] * 4);
                fVar9 = *(float *)(_ai + (long)((int)c_elem[1] + 1) * 4);
                fVar1 = _ci[1];
                fVar2 = *_ci;
                *(float *)(_ai + (long)(int)c_elem[1] * 4) =
                     fVar8 * *_ci + -(fVar9 * _ci[1]) + local_d8;
                *(float *)(_ai + (long)((int)c_elem[1] + 1) * 4) =
                     fVar8 * fVar1 + fVar9 * fVar2 + local_d4;
                c_elem[1] = (float)(iVar10 + (int)c_elem[1]);
                a_elem[1] = (float)(iVar13 + (int)a_elem[1]);
              }
              a_elem[0] = (float)((int)a_elem[0] + 2);
              ldc = iVar11 + ldc;
            }
          }
          else {
            a_elem[0] = 0.0;
            ldc = 0;
            for (k = 0; k < iVar5; k = k + 1) {
              c_elem[1] = a_elem[0];
              a_elem[1] = 0.0;
              for (lda = 0; lda < iVar6; lda = lda + 1) {
                b_elem[1] = (float)ldc;
                b_elem[0] = a_elem[1];
                local_d4 = 0.0;
                local_d8 = 0.0;
                for (ldb = 0; ldb < iVar7; ldb = ldb + 1) {
                  fVar8 = *(float *)(_incci + (long)(int)b_elem[1] * 4);
                  local_b4 = *(float *)(_incci + (long)((int)b_elem[1] + 1) * 4);
                  fVar9 = *(float *)(_incai + (long)(int)b_elem[0] * 4);
                  local_bc = *(float *)(_incai + (long)((int)b_elem[0] + 1) * 4);
                  if ((*in_RDI == 'c') || (*in_RDI == 'C')) {
                    local_b4 = -local_b4;
                  }
                  if ((*in_RSI == 'c') || (*in_RSI == 'C')) {
                    local_bc = -local_bc;
                  }
                  local_d8 = local_d8 + fVar8 * fVar9 + -(local_b4 * local_bc);
                  local_d4 = local_d4 + fVar8 * local_bc + local_b4 * fVar9;
                  b_elem[1] = (float)(iVar12 + (int)b_elem[1]);
                  b_elem[0] = (float)(iVar14 + (int)b_elem[0]);
                }
                *(float *)(_ai + (long)(int)c_elem[1] * 4) = local_d8;
                *(float *)(_ai + (long)((int)c_elem[1] + 1) * 4) = local_d4;
                c_elem[1] = (float)(iVar10 + (int)c_elem[1]);
                a_elem[1] = (float)(iVar13 + (int)a_elem[1]);
              }
              a_elem[0] = (float)((int)a_elem[0] + 2);
              ldc = iVar11 + ldc;
            }
          }
        }
        else {
          a_elem[0] = 0.0;
          for (k = 0; k < iVar5; k = k + 1) {
            c_elem[1] = a_elem[0];
            for (lda = 0; lda < iVar6; lda = lda + 1) {
              fVar8 = *(float *)(_ai + (long)(int)c_elem[1] * 4);
              fVar9 = *(float *)(_ai + (long)((int)c_elem[1] + 1) * 4);
              fVar1 = _ci[1];
              fVar2 = *_ci;
              *(float *)(_ai + (long)(int)c_elem[1] * 4) = fVar8 * *_ci + -(fVar9 * _ci[1]);
              *(float *)(_ai + (long)((int)c_elem[1] + 1) * 4) = fVar8 * fVar1 + fVar9 * fVar2;
              c_elem[1] = (float)(iVar10 + (int)c_elem[1]);
            }
            a_elem[0] = (float)((int)a_elem[0] + 2);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
xb_cgemm (char * transa, char *transb, int *M, int *N, int *K,
	  const void *alpha, const void *a, int *p_lda, const void *b, 
	  int *p_ldb, const void *beta, void *c, int *p_ldc)
/* 
 * Purpose
 * =======
 *
 * This routine computes the matrix product:
 *
 *      C   <-  alpha * op(A) * op(B)  +  beta * C .
 * 
 * where op(M) represents either M, M transpose, 
 * or M conjugate transpose.
 *
 * Arguments
 * =========
 *
 * order   (input) enum blas_order_type
 *         Storage  of input matrices A, B, and C.
 *
 * transa  (input) enum blas_trans_type
 *         Operation to be done on matrix A before multiplication.
 *         Can be no operation, transposition, or conjugate transposition.
 *
 * transb  (input) enum blas_trans_type
 *         Operation to be done on matrix B before multiplication.
 *         Can be no operation, transposition, or conjugate transposition.
 * 
 * m n k   (input) int
 *         The dimensions of matrices A, B, and C.
 *         Matrix C is m-by-n matrix.
 *         Matrix A is m-by-k if A is not transposed, 
 *                     k-by-m otherwise.
 *         Matrix B is k-by-n if B is not transposed, 
 *                     n-by-k otherwise.
 *      
 * alpha   (input) const void*
 *
 * a       (input) const void*
 *         matrix A.
 * 
 * lda     (input) int
 *         leading dimension of A.
 * 
 * b       (input) const void*
 *         matrix B
 *
 * ldb     (input) int
 *         leading dimension of B.
 *
 * beta    (input) const void*
 *
 * c       (input/output) void*
 *         matrix C
 *
 * ldc     (input) int
 *         leading dimension of C.
 *
 */
{


    /* Integer Index Variables */
    int i, j, h;

    int ai, bj, ci;
    int aih, bhj, cij;		/* Index into matrices a, b, c during multiply */

    int incai, incaih;		/* Index increments for matrix a */
    int incbj, incbhj;		/* Index increments for matrix b */
    int incci, inccij;		/* Index increments for matrix c */

    /* Input Matrices */
    const float *a_i = (float *) a;
    const float *b_i = (float *) b;

    /* Output Matrix */
    float *c_i = (float *) c;

    /* Input Scalars */
    float *alpha_i = (float *) alpha;
    float *beta_i = (float *) beta;
    int m=*M, n=*N, k=*K;
    int lda=*p_lda, ldb=*p_ldb, ldc=*p_ldc;

    /* Temporary Floating-Point Variables */
    float a_elem[2];
    float b_elem[2];
    float c_elem[2];
    float prod[2];
    float sum[2];
    float tmp1[2];
    float tmp2[2];

    char order = COLMAJOR; /* For the time being, it is always COLMAJOR.
			      Eventually, it might change. */

#if MDEBUG
    printf("In Zgemm\n");
#endif

    /* Test for error conditions */
    if (m <= 0 || n <= 0 || k <= 0)
    {
	return;
    }

    if (order == COLMAJOR)
    {

	if (ldc < m)
	    return;

	if (*transa == 'n' || *transa == 'N')
	{
	    if (lda < m)
		return;
	}
	else
	{
	    if (lda < k)
		return;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    if (ldb < k)
		return;
	}
	else
	{
	    if (ldb < n)
		return;
	}

    }
    else
    {
	/* row major */
	if (ldc < n)
	    return;

	if (*transa == 'n' || *transa == 'N')
	{
	    if (lda < k)
		return;
	}
	else
	{
	    if (lda < m)
		return;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    if (ldb < n)
		return;
	}
	else
	{
	    if (ldb < k)
		return;
	}
    }

    /* Test for no-op */
    if (alpha_i[0] == 0.0 && alpha_i[1] == 0.0
	&& (beta_i[0] == 1.0 && beta_i[1] == 0.0))
    {
	return;
    }

    /* Set Index Parameters */
    if (order == COLMAJOR)
    {
	incci = 1;
	inccij = ldc;

	if (*transa == 'n' || *transa == 'N')
	{
	    incai = 1;
	    incaih = lda;
	}
	else
	{
	    incai = lda;
	    incaih = 1;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    incbj = ldb;
	    incbhj = 1;
	}
	else
	{
	    incbj = 1;
	    incbhj = ldb;
	}

    }
    else
    {
	/* row major */
	incci = ldc;
	inccij = 1;

	if (*transa == 'n' || *transa == 'N')
	{
	    incai = lda;
	    incaih = 1;
	}
	else
	{
	    incai = 1;
	    incaih = lda;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    incbj = 1;
	    incbhj = ldb;
	}
	else
	{
	    incbj = ldb;
	    incbhj = 1;
	}

    }



    /* Ajustment to increments */
    incci *= 2;
    inccij *= 2;
    incai *= 2;
    incaih *= 2;
    incbj *= 2;
    incbhj *= 2;

    /* alpha = 0.  In this case, just return beta * C */
    if (alpha_i[0] == 0.0 && alpha_i[1] == 0.0)
    {

	ci = 0;
	for (i = 0; i < m; i++, ci += incci)
	{
	    cij = ci;
	    for (j = 0; j < n; j++, cij += inccij)
	    {
		c_elem[0] = c_i[cij];
		c_elem[1] = c_i[cij + 1];
		{
		    tmp1[0] =
			(float) c_elem[0] * beta_i[0] -
			(float) c_elem[1] * beta_i[1];
		    tmp1[1] =
			(float) c_elem[0] * beta_i[1] +
			(float) c_elem[1] * beta_i[0];
		}
		c_i[cij] = tmp1[0];
		c_i[cij + 1] = tmp1[1];
	    }
	}

    }
    else if ((alpha_i[0] == 1.0 && alpha_i[1] == 0.0))
    {

	/* Case alpha == 1. */

	if (beta_i[0] == 0.0 && beta_i[1] == 0.0)
	{
	    /* Case alpha == 1, beta == 0.   We compute  C <--- A * B */

	    ci = 0;
	    ai = 0;
	    for (i = 0; i < m; i++, ci += incci, ai += incai)
	    {

		cij = ci;
		bj = 0;

		for (j = 0; j < n; j++, cij += inccij, bj += incbj)
		{

		    aih = ai;
		    bhj = bj;

		    sum[0] = sum[1] = 0.0;

		    for (h = 0; h < k; h++, aih += incaih, bhj += incbhj)
		    {
			a_elem[0] = a_i[aih];
			a_elem[1] = a_i[aih + 1];
			b_elem[0] = b_i[bhj];
			b_elem[1] = b_i[bhj + 1];
			if (*transa == 'c' || *transa == 'C')
			{
			  a_elem[1] = -a_elem[1];
			}
			if (*transb == 'c' || *transb == 'C')
			{
			    b_elem[1] = -b_elem[1];
			}
			
			{
			    prod[0] =
				(float) a_elem[0] * b_elem[0] -
				(float) a_elem[1] * b_elem[1];
			    prod[1] =
				(float) a_elem[0] * b_elem[1] +
				(float) a_elem[1] * b_elem[0];
			}
			sum[0] = sum[0] + prod[0];
			sum[1] = sum[1] + prod[1];
		    }
		    tmp1[0] = sum[0];
		    tmp1[1] = sum[1];
		    c_i[cij] = tmp1[0];
		    c_i[cij + 1] = tmp1[1];
		}
	    }

	}
	else
	{
	    /* Case alpha == 1, but beta != 0.
	       We compute   C <--- A * B + beta * C   */

	    ci = 0;
	    ai = 0;
	    for (i = 0; i < m; i++, ci += incci, ai += incai)
	    {

		cij = ci;
		bj = 0;

		for (j = 0; j < n; j++, cij += inccij, bj += incbj)
		{

		    aih = ai;
		    bhj = bj;

		    sum[0] = sum[1] = 0.0;

		    for (h = 0; h < k; h++, aih += incaih, bhj += incbhj)
		    {
			a_elem[0] = a_i[aih];
			a_elem[1] = a_i[aih + 1];
			b_elem[0] = b_i[bhj];
			b_elem[1] = b_i[bhj + 1];
			if (*transa == 'c' || *transa == 'C')
			{
			    a_elem[1] = -a_elem[1];
			}
			if (*transb == 'c' || *transb == 'C')
			{
			    b_elem[1] = -b_elem[1];
			}
			{
			    prod[0] =
				(float) a_elem[0] * b_elem[0] -
				(float) a_elem[1] * b_elem[1];
			    prod[1] =
				(float) a_elem[0] * b_elem[1] +
				(float) a_elem[1] * b_elem[0];
			}
			sum[0] = sum[0] + prod[0];
			sum[1] = sum[1] + prod[1];
		    }

		    c_elem[0] = c_i[cij];
		    c_elem[1] = c_i[cij + 1];
		    {
			tmp2[0] =
			    (float) c_elem[0] * beta_i[0] -
			    (float) c_elem[1] * beta_i[1];
			tmp2[1] =
			    (float) c_elem[0] * beta_i[1] +
			    (float) c_elem[1] * beta_i[0];
		    }
		    tmp1[0] = sum[0];
		    tmp1[1] = sum[1];
		    tmp1[0] = tmp2[0] + tmp1[0];
		    tmp1[1] = tmp2[1] + tmp1[1];
		    c_i[cij] = tmp1[0];
		    c_i[cij + 1] = tmp1[1];
		}
	    }
	}

    }
    else
    {

	/* The most general form,   C <-- alpha * A * B + beta * C  */
	ci = 0;
	ai = 0;
	for (i = 0; i < m; i++, ci += incci, ai += incai)
	{

	    cij = ci;
	    bj = 0;

	    for (j = 0; j < n; j++, cij += inccij, bj += incbj)
	    {

		aih = ai;
		bhj = bj;

		sum[0] = sum[1] = 0.0;

		for (h = 0; h < k; h++, aih += incaih, bhj += incbhj)
		{
		    a_elem[0] = a_i[aih];
		    a_elem[1] = a_i[aih + 1];
		    b_elem[0] = b_i[bhj];
		    b_elem[1] = b_i[bhj + 1];
		    if (*transa == 'c' || *transa == 'C')
		    {
			a_elem[1] = -a_elem[1];
		    }
		    if (*transb == 'c' || *transb == 'C')
		    {
			b_elem[1] = -b_elem[1];
		    }
		    {
			prod[0] =
			    (float) a_elem[0] * b_elem[0] -
			    (float) a_elem[1] * b_elem[1];
			prod[1] =
			    (float) a_elem[0] * b_elem[1] +
			    (float) a_elem[1] * b_elem[0];
		    }
		    sum[0] = sum[0] + prod[0];
		    sum[1] = sum[1] + prod[1];
		}

		{
		    tmp1[0] =
			(float) sum[0] * alpha_i[0] -
			(float) sum[1] * alpha_i[1];
		    tmp1[1] =
			(float) sum[0] * alpha_i[1] +
			(float) sum[1] * alpha_i[0];
		}
		c_elem[0] = c_i[cij];
		c_elem[1] = c_i[cij + 1];
		{
		    tmp2[0] =
			(float) c_elem[0] * beta_i[0] -
			(float) c_elem[1] * beta_i[1];
		    tmp2[1] =
			(float) c_elem[0] * beta_i[1] +
			(float) c_elem[1] * beta_i[0];
		}
		tmp1[0] = tmp1[0] + tmp2[0];
		tmp1[1] = tmp1[1] + tmp2[1];
		c_i[cij] = tmp1[0];
		c_i[cij + 1] = tmp1[1];
	    }
	}

    }



}